

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3>::
TriangleStipGen(CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3> *this,
               CColorArray *coords,float widthStart,float widthEnd,float heightStart,float heightEnd
               ,uint primNum)

{
  uint i;
  int iVar1;
  int iVar2;
  uint j;
  int iVar3;
  float fVar4;
  Vector<float,_4> local_4c;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  iVar2 = (int)coords;
  local_3c = 2.0 / (float)iVar2;
  local_2c = (widthEnd - widthStart) / (float)iVar2;
  local_30 = widthStart;
  for (iVar1 = 0; iVar1 != iVar2; iVar1 = iVar1 + 1) {
    local_34 = (float)iVar1 * local_2c + local_30;
    local_38 = local_2c + local_34;
    for (iVar3 = 0; iVar2 != iVar3; iVar3 = iVar3 + 1) {
      fVar4 = (float)iVar3 * local_3c + -1.0;
      local_4c.m_data[1] = local_34;
      local_4c.m_data[2] = 0.0;
      local_4c.m_data[3] = 1.0;
      local_4c.m_data[0] = fVar4;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,&local_4c
                );
      local_4c.m_data[1] = local_38;
      local_4c.m_data[2] = 0.0;
      local_4c.m_data[3] = 1.0;
      local_4c.m_data[0] = fVar4;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,&local_4c
                );
      fVar4 = fVar4 + local_3c;
      local_4c.m_data[1] = local_34;
      local_4c.m_data[2] = 0.0;
      local_4c.m_data[3] = 1.0;
      local_4c.m_data[0] = fVar4;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,&local_4c
                );
      local_4c.m_data[1] = local_38;
      local_4c.m_data[2] = 0.0;
      local_4c.m_data[3] = 1.0;
      local_4c.m_data[0] = fVar4;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)this,&local_4c
                );
    }
  }
  return;
}

Assistant:

void TriangleStipGen(CColorArray& coords, float widthStart, float widthEnd, float heightStart, float heightEnd,
						 unsigned int primNum)
	{
		float widthStep  = (widthEnd - widthStart) / static_cast<float>(primNum);
		float heightStep = (heightEnd - heightStart) / static_cast<float>(primNum);
		for (unsigned int i = 0; i < primNum; ++i)
		{
			float heightOffset = heightStart + heightStep * static_cast<float>(i);
			for (unsigned int j = 0; j < primNum; ++j)
			{
				float widthOffset = widthStart + widthStep * static_cast<float>(j);

				coords.push_back(tcu::Vec4(widthOffset, heightOffset, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset, heightOffset + heightStep, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset + widthStep, heightOffset, 0.0f, 1.0f));
				coords.push_back(tcu::Vec4(widthOffset + widthStep, heightOffset + heightStep, 0.0f, 1.0f));
			}
		}
	}